

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

void adjust_slots_reserved_size(int type,key_slots *slots)

{
  size_t sVar1;
  uint8_t *puVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  size_t local_30;
  uint8_t *b;
  size_t size;
  key_slots *slots_local;
  int type_local;
  
  if ((slots->reserved_size == 0) || (slots->reserved_size <= slots->size)) {
    if (slots->reserved_size == 0) {
      local_30 = 0x2000;
    }
    else {
      sVar1 = slots->reserved_size;
      auVar5._8_4_ = (int)(sVar1 >> 0x20);
      auVar5._0_8_ = sVar1;
      auVar5._12_4_ = 0x45300000;
      dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.5;
      uVar3 = (ulong)dVar4;
      uVar3 = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
      local_30 = (uVar3 + 0x3f + sVar1) - (uVar3 + slots->reserved_size + 0x3f & 0x3f);
    }
    if (type == 1) {
      daemon_vars.keys.keys = (RSA **)realloc(daemon_vars.keys.keys,local_30 << 3);
      if (daemon_vars.keys.keys == (RSA **)0x0) {
        dief("no memory");
      }
    }
    else {
      if (type != 2) {
        dief("invalid type adjusting reserved");
      }
      daemon_vars.keys.ecdsa_keys = (EC_KEY **)realloc(daemon_vars.keys.ecdsa_keys,local_30 << 3);
      if (daemon_vars.keys.ecdsa_keys == (EC_KEY **)0x0) {
        dief("no memory");
      }
    }
    puVar2 = (uint8_t *)realloc(slots->bita_avail,local_30 + 7 >> 3);
    if (puVar2 == (uint8_t *)0x0) {
      dief("no memory");
    }
    memset(puVar2 + (slots->reserved_size + 7 >> 3),0xff,(local_30 - slots->reserved_size) + 7 >> 3)
    ;
    slots->bita_avail = puVar2;
    slots->reserved_size = local_30;
  }
  return;
}

Assistant:

static void adjust_slots_reserved_size(int type, struct key_slots *slots)
{
#define ROUND2WORD(n) (n + 64 - 1 - (n + 64 - 1) % 64)
    if (!slots->reserved_size || (slots->size >= slots->reserved_size)) {
        size_t size = slots->reserved_size ? ROUND2WORD((size_t)(slots->reserved_size * 0.50) + slots->reserved_size)
                : default_reserved_size;
#undef ROUND2WORD

        switch (type) {
        case NEVERBLEED_TYPE_RSA:
            if ((daemon_vars.keys.keys = realloc(daemon_vars.keys.keys, sizeof(*daemon_vars.keys.keys) * size)) == NULL)
                dief("no memory");
            break;
        case NEVERBLEED_TYPE_ECDSA:
            if ((daemon_vars.keys.ecdsa_keys = realloc(daemon_vars.keys.ecdsa_keys, sizeof(*daemon_vars.keys.ecdsa_keys) * size)) == NULL)
                dief("no memory");
            break;
        default:
            dief("invalid type adjusting reserved");
        }

        uint8_t *b;
        if ((b = realloc(slots->bita_avail, BITBYTES(size))) == NULL)
            dief("no memory");

        /* set all bits to 1 making all slots available */
        memset(&b[BITBYTES(slots->reserved_size)], 0xff, BITBYTES(size - slots->reserved_size));

        slots->bita_avail = b;
        slots->reserved_size = size;
    }
}